

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim.c
# Opt level: O0

void getUnixString(char *to,int size,object *from)

{
  uint uVar1;
  byteObject *bobj;
  int fsize;
  int i;
  object *from_local;
  int size_local;
  char *to_local;
  
  uVar1 = (uint)(from->header >> 2) & 0x3fffffff;
  if (size <= (int)uVar1) {
    error_impl("getUnixString",0x256,"getUnixString(): String too long, %d, for buffer, %d bytes!",
               (ulong)uVar1,(ulong)(uint)size);
  }
  for (bobj._4_4_ = 0; bobj._4_4_ < (int)uVar1; bobj._4_4_ = bobj._4_4_ + 1) {
    to[bobj._4_4_] = *(char *)((long)&from[1].header + (long)bobj._4_4_);
  }
  to[bobj._4_4_] = '\0';
  return;
}

Assistant:

void getUnixString(char * to, int size, struct object * from)
{
    int i;
    int fsize = SIZE(from);
    struct byteObject * bobj = (struct byteObject *) from;

    if (fsize >= size) {
        error("getUnixString(): String too long, %d, for buffer, %d bytes!", fsize, size);
    }

    for (i = 0; i < fsize; i++) {
        to[i] = (char)bobj->bytes[i];
    }

    to[i] = '\0';	/* put null terminator at end */
}